

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::BeginFrameObserverState>::operator=
          (CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> *this,
          CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> *other)

{
  perfetto::protos::gen::BeginFrameObserverState::operator=
            ((this->ptr_)._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameObserverState,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
             .super__Head_base<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_false>.
             _M_head_impl,
             (other->ptr_)._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameObserverState,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
             .super__Head_base<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_false>.
             _M_head_impl);
  return this;
}

Assistant:

CopyablePtr& operator=(const CopyablePtr& other) {
    *ptr_ = *other.ptr_;
    return *this;
  }